

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

int smooth_(int *n,double *x,double *y,double *w,double *span,int *iper,double *vsmlsq,double *smo,
           double *acvr)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dStack_e0;
  int jper;
  double cvar;
  double xto;
  double dStack_c8;
  int out;
  double xti;
  double tmp;
  double var;
  double dStack_a8;
  int ibw;
  double fbw;
  double fbo;
  double sy;
  double wt;
  double ym;
  double xm;
  int local_70;
  int it;
  int in;
  int j0;
  int j;
  int i__;
  double h__;
  double a;
  double d__1;
  double r__1;
  int i__1;
  int *iper_local;
  double *span_local;
  double *w_local;
  double *y_local;
  double *x_local;
  int *n_local;
  
  ym = 0.0;
  wt = 0.0;
  tmp = 0.0;
  dStack_e0 = 0.0;
  dStack_a8 = 0.0;
  iVar2 = iabs(*iper);
  var._4_4_ = (int)(*span * 0.5 * (double)*n + 0.5);
  if (var._4_4_ < 2) {
    var._4_4_ = 2;
  }
  for (j0 = 1; j0 <= var._4_4_ * 2 + 1; j0 = j0 + 1) {
    in = j0;
    if (iVar2 == 2) {
      in = (j0 - var._4_4_) + -1;
    }
    dStack_c8 = x[(long)in + -1];
    if (in < 1) {
      in = *n + in;
      dStack_c8 = x[(long)in + -1] - 1.0;
    }
    dVar6 = w[(long)in + -1];
    dVar5 = dVar6 + dStack_a8;
    if (0.0 < dVar5) {
      ym = (dStack_a8 * ym + dVar6 * dStack_c8) / dVar5;
      wt = (dStack_a8 * wt + dVar6 * y[(long)in + -1]) / dVar5;
    }
    xti = 0.0;
    if (0.0 < dStack_a8) {
      xti = (dVar5 * dVar6 * (dStack_c8 - ym)) / dStack_a8;
    }
    tmp = xti * (dStack_c8 - ym) + tmp;
    dStack_e0 = xti * (y[(long)in + -1] - wt) + dStack_e0;
    dStack_a8 = dVar5;
  }
  iVar1 = *n;
  for (in = 1; in <= iVar1; in = in + 1) {
    xto._4_4_ = (in - var._4_4_) + -1;
    local_70 = in + var._4_4_;
    if ((iVar2 == 2) || ((0 < xto._4_4_ && (local_70 <= *n)))) {
      if (xto._4_4_ < 1) {
        xto._4_4_ = *n + xto._4_4_;
        cvar = x[(long)xto._4_4_ + -1] - 1.0;
        dStack_c8 = x[(long)local_70 + -1];
      }
      else if (*n < local_70) {
        local_70 = local_70 - *n;
        dStack_c8 = x[(long)local_70 + -1] + 1.0;
        cvar = x[(long)xto._4_4_ + -1];
      }
      else {
        cvar = x[(long)xto._4_4_ + -1];
        dStack_c8 = x[(long)local_70 + -1];
      }
      dVar6 = w[(long)xto._4_4_ + -1];
      dVar5 = dStack_a8 - dVar6;
      xti = 0.0;
      if (0.0 < dVar5) {
        xti = (dStack_a8 * dVar6 * (cvar - ym)) / dVar5;
      }
      dVar7 = cvar - ym;
      dVar3 = -xti;
      dVar8 = y[(long)xto._4_4_ + -1] - wt;
      dVar4 = -xti;
      if (0.0 < dVar5) {
        ym = (dStack_a8 * ym + -(dVar6 * cvar)) / dVar5;
        wt = (dStack_a8 * wt + -(dVar6 * y[(long)xto._4_4_ + -1])) / dVar5;
      }
      dVar6 = w[(long)local_70 + -1];
      dStack_a8 = dVar6 + dVar5;
      if (0.0 < dStack_a8) {
        ym = (dVar5 * ym + dVar6 * dStack_c8) / dStack_a8;
        wt = (dVar5 * wt + dVar6 * y[(long)local_70 + -1]) / dStack_a8;
      }
      xti = 0.0;
      if (0.0 < dVar5) {
        xti = (dStack_a8 * dVar6 * (dStack_c8 - ym)) / dVar5;
      }
      tmp = xti * (dStack_c8 - ym) + dVar3 * dVar7 + tmp;
      dStack_e0 = xti * (y[(long)local_70 + -1] - wt) + dVar4 * dVar8 + dStack_e0;
    }
    h__ = 0.0;
    if (*vsmlsq <= tmp && tmp != *vsmlsq) {
      h__ = dStack_e0 / tmp;
    }
    smo[(long)in + -1] = h__ * (x[(long)in + -1] - ym) + wt;
    if (0 < *iper) {
      _j = 0.0;
      if (0.0 < dStack_a8) {
        _j = 1.0 / dStack_a8;
      }
      if (*vsmlsq <= tmp && tmp != *vsmlsq) {
        _j = ((x[(long)in + -1] - ym) * (x[(long)in + -1] - ym)) / tmp + _j;
      }
      acvr[(long)in + -1] = 0.0;
      dVar6 = -w[(long)in + -1] * _j + 1.0;
      if (0.0 < dVar6) {
        acvr[(long)in + -1] = ABS(y[(long)in + -1] - smo[(long)in + -1]) / dVar6;
      }
      else if (1 < in) {
        acvr[(long)in + -1] = acvr[(long)(in + -1) + -1];
      }
    }
  }
  in = 1;
  do {
    j0 = in;
    fbo = smo[(long)in + -1] * w[(long)in + -1];
    dStack_a8 = w[(long)in + -1];
    if (in < *n) {
      do {
        if (x[(long)in + -1] <= x[(long)(in + 1) + -1] && x[(long)(in + 1) + -1] != x[(long)in + -1]
           ) break;
        in = in + 1;
        fbo = w[(long)in + -1] * smo[(long)in + -1] + fbo;
        dStack_a8 = w[(long)in + -1] + dStack_a8;
      } while (in < *n);
    }
    if (j0 < in) {
      h__ = 0.0;
      if (0.0 < dStack_a8) {
        h__ = fbo / dStack_a8;
      }
      for (; j0 <= in; j0 = j0 + 1) {
        smo[(long)j0 + -1] = h__;
      }
    }
    in = in + 1;
    if (*n < in) {
      return 0;
    }
  } while( true );
}

Assistant:

static int smooth_(int *n, double *x, double *y, double *w, double *span, int *iper, double *vsmlsq, double *smo, double *acvr)
{
    /* System generated locals */
    int i__1;
    double r__1;
    double d__1;

    /* Local variables */
    double a, h__;
    int i__, j, j0, in, it;
    double xm, ym, wt, sy, fbo, fbw;
    int ibw;
    double var, tmp;
    double xti;
    int out;
    double xto;
    double cvar;
    int jper;

    /* Parameter adjustments */
    --acvr;
    --smo;
    --w;
    --y;
    --x;

    /* Function Body */
    xm = 0.f;
    ym = xm;
    var = ym;
    cvar = var;
    fbw = cvar;
    jper = iabs(*iper);
    ibw = *span * .5 * *n + .5;
    if (ibw < 2) {
	ibw = 2;
    }
    it = (ibw << 1) + 1;
    i__1 = it;
    for (i__ = 1; i__ <= i__1; ++i__) {
	j = i__;
	if (jper == 2) {
	    j = i__ - ibw - 1;
	}
	xti = x[j];
	if (j >= 1) {
	    goto L10;
	}
	j = *n + j;
	xti = x[j] - 1.0;
L10:
	wt = w[j];
	fbo = fbw;
	fbw += wt;
	if (fbw > 0.0) {
	    xm = (fbo * xm + wt * xti) / fbw;
	}
	if (fbw > 0.0) {
	    ym = (fbo * ym + wt * y[j]) / fbw;
	}
	tmp = 0.0;
	if (fbo > 0.0) {
	    tmp = fbw * wt * (xti - xm) / fbo;
	}
	var += tmp * (xti - xm);
	cvar += tmp * (y[j] - ym);
/* L20: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	out = j - ibw - 1;
	in = j + ibw;
	if (jper != 2 && (out < 1 || in > *n)) {
	    goto L60;
	}
	if (out >= 1) {
	    goto L30;
	}
	out = *n + out;
	xto = x[out] - 1.0;
	xti = x[in];
	goto L50;
L30:
	if (in <= *n) {
	    goto L40;
	}
	in -= *n;
	xti = x[in] + 1.0;
	xto = x[out];
	goto L50;
L40:
	xto = x[out];
	xti = x[in];
L50:
	wt = w[out];
	fbo = fbw;
	fbw -= wt;
	tmp = 0.0;
	if (fbw > 0.0) {
	    tmp = fbo * wt * (xto - xm) / fbw;
	}
	var -= tmp * (xto - xm);
	cvar -= tmp * (y[out] - ym);
	if (fbw > 0.0) {
	    xm = (fbo * xm - wt * xto) / fbw;
	}
	if (fbw > 0.0) {
	    ym = (fbo * ym - wt * y[out]) / fbw;
	}
	wt = w[in];
	fbo = fbw;
	fbw += wt;
	if (fbw > 0.0) {
	    xm = (fbo * xm + wt * xti) / fbw;
	}
	if (fbw > 0.0) {
	    ym = (fbo * ym + wt * y[in]) / fbw;
	}
	tmp = 0.0;
	if (fbo > 0.0) {
	    tmp = fbw * wt * (xti - xm) / fbo;
	}
	var += tmp * (xti - xm);
	cvar += tmp * (y[in] - ym);
L60:
	a = 0.0;
	if (var > *vsmlsq) {
	    a = cvar / var;
	}
	smo[j] = a * (x[j] - xm) + ym;
	if (*iper <= 0) {
	    goto L80;
	}
	h__ = 0.0;
	if (fbw > 0.0) {
	    h__ = 1.0 / fbw;
	}
	if (var > *vsmlsq) {
/* Computing 2nd power */
	    d__1 = x[j] - xm;
	    h__ += d__1 * d__1 / var;
	}
	acvr[j] = 0.0;
	a = 1.0 - w[j] * h__;
	if (a <= 0.0) {
	    goto L70;
	}
	acvr[j] = (r__1 = y[j] - smo[j], fabs(r__1)) / a;
	goto L80;
L70:
	if (j <= 1) {
	    goto L80;
	}
	acvr[j] = acvr[j - 1];
L80:
	;
    }
    j = 1;
L90:
    j0 = j;
    sy = smo[j] * w[j];
    fbw = w[j];
    if (j >= *n) {
	goto L110;
    }
L100:
    if (x[j + 1] > x[j]) {
	goto L110;
    }
    ++j;
    sy += w[j] * smo[j];
    fbw += w[j];
    if (j < *n) {
	goto L100;
    }
L110:
    if (j <= j0) {
	goto L130;
    }
    a = 0.0;
    if (fbw > 0.0) {
	a = sy / fbw;
    }
    i__1 = j;
    for (i__ = j0; i__ <= i__1; ++i__) {
	smo[i__] = a;
/* L120: */
    }
L130:
    ++j;
    if (j <= *n) {
	goto L90;
    }
    return 0;
}